

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::huff_decode(jpeg_decoder *this,huff_tables *pH,int *extra_bits)

{
  uint uVar1;
  uint uVar2;
  uint *in_RDX;
  long in_RSI;
  jpeg_decoder *in_RDI;
  int bits;
  int num_extra_bits;
  int code_size;
  uint idx;
  int ofs;
  int symbol;
  jpgd_status in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_20;
  uint local_1c;
  
  if (in_RSI == 0) {
    stop_decoding((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc);
  }
  uVar1 = *(uint *)(in_RSI + 0x404 + (ulong)(in_RDI->m_bit_buf >> 0x18) * 4);
  if ((int)uVar1 < 0) {
    local_20 = 0x17;
    do {
      local_1c = uVar1;
      uVar1 = -(local_1c + (in_RDI->m_bit_buf >> ((byte)local_20 & 0x1f) & 1));
      if ((0x1ff < uVar1) || (local_20 < 0)) {
        stop_decoding((jpeg_decoder *)CONCAT44(local_1c,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
      }
      uVar1 = *(uint *)(in_RSI + 0x904 + (ulong)uVar1 * 4);
      local_20 = local_20 + -1;
    } while ((int)uVar1 < 0);
    get_bits_no_markers(in_RDI,local_1c);
    uVar2 = get_bits_no_markers(in_RDI,local_1c);
    *in_RDX = uVar2;
    local_1c = uVar1;
  }
  else {
    if ((uVar1 & 0x8000) == 0) {
      if (((int)uVar1 >> 8 & 0x1fU) + (uVar1 & 0xf) < 0x11) {
        uVar2 = get_bits_no_markers(in_RDI,in_stack_ffffffffffffffc4);
        *in_RDX = uVar2 & (1 << (sbyte)(uVar1 & 0xf)) - 1U;
      }
      else {
        get_bits_no_markers(in_RDI,in_stack_ffffffffffffffc4);
        uVar2 = get_bits_no_markers(in_RDI,in_stack_ffffffffffffffc4);
        *in_RDX = uVar2;
      }
    }
    else {
      if (0xf < ((int)uVar1 >> 8 & 0x1fU)) {
        __assert_fail("((symbol >> 8) & 31) <= 15",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                      ,0x230,"int jpgd::jpeg_decoder::huff_decode(huff_tables *, int &)");
      }
      get_bits_no_markers(in_RDI,in_stack_ffffffffffffffc4);
      *in_RDX = (int)uVar1 >> 0x10;
    }
    local_1c = uVar1 & 0xff;
  }
  return local_1c;
}

Assistant:

inline int jpeg_decoder::huff_decode(huff_tables* pH, int& extra_bits)
	{
		int symbol;

		if (!pH)
			stop_decoding(JPGD_DECODE_ERROR);

		// Check first 8-bits: do we have a complete symbol?
		if ((symbol = pH->look_up2[m_bit_buf >> 24]) < 0)
		{
			// Use a tree traversal to find symbol.
			int ofs = 23;
			do
			{
				unsigned int idx = -(int)(symbol + ((m_bit_buf >> ofs) & 1));

				// This should never happen, but to be safe I'm turning these asserts into a run-time check.
				if ((idx >= JPGD_HUFF_TREE_MAX_LENGTH) || (ofs < 0))
					stop_decoding(JPGD_DECODE_ERROR);

				symbol = pH->tree[idx];
				ofs--;
			} while (symbol < 0);

			get_bits_no_markers(8 + (23 - ofs));

			extra_bits = get_bits_no_markers(symbol & 0xF);
		}
		else
		{
			if (symbol & 0x8000)
			{
				//get_bits_no_markers((symbol >> 8) & 31);
				assert(((symbol >> 8) & 31) <= 15);
				get_bits_no_markers((symbol >> 8) & 15);
				extra_bits = symbol >> 16;
			}
			else
			{
				int code_size = (symbol >> 8) & 31;
				int num_extra_bits = symbol & 0xF;
				int bits = code_size + num_extra_bits;

				if (bits <= 16)
					extra_bits = get_bits_no_markers(bits) & ((1 << num_extra_bits) - 1);
				else
				{
					get_bits_no_markers(code_size);
					extra_bits = get_bits_no_markers(num_extra_bits);
				}
			}

			symbol &= 0xFF;
		}

		return symbol;
	}